

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
defyx::VmBase<defyx::AlignedAllocator<64UL>,_true>::allocate
          (VmBase<defyx::AlignedAllocator<64UL>,_true> *this)

{
  invalid_argument *this_00;
  void *pvVar1;
  size_t in_RDI;
  
  if (*(long *)(in_RDI + 0x3f8) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cache/Dataset not set");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar1 = AlignedAllocator<64UL>::allocMemory(in_RDI);
  *(void **)(in_RDI + 0x3f0) = pvVar1;
  return;
}

Assistant:

void VmBase<Allocator, softAes>::allocate() {
		if (datasetPtr == nullptr)
			throw std::invalid_argument("Cache/Dataset not set");
		if (!softAes) { //if hardware AES is not supported, it's better to fail now than to return a ticking bomb
			rx_vec_i128 tmp = rx_load_vec_i128((const rx_vec_i128*)&aesDummy);
			tmp = rx_aesenc_vec_i128(tmp, tmp);
			rx_store_vec_i128((rx_vec_i128*)&aesDummy, tmp);
		}
		scratchpad = (uint8_t*)Allocator::allocMemory(ScratchpadSize);
	}